

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umapfile.cpp
# Opt level: O0

UBool uprv_mapFile_63(UDataMemory *pData,char *path,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  DataHeader *pDVar3;
  void *data;
  stat mystat;
  int length;
  int fd;
  UErrorCode *status_local;
  char *path_local;
  UDataMemory *pData_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    UDataMemory_init_63(pData);
    iVar2 = stat(path,(stat *)&data);
    if ((iVar2 == 0) && (0 < (long)mystat.st_rdev)) {
      mystat.__glibc_reserved[2]._0_4_ = (int)mystat.st_rdev;
      mystat.__glibc_reserved[2]._4_4_ = open(path,0);
      if (mystat.__glibc_reserved[2]._4_4_ == -1) {
        pData_local._7_1_ = '\0';
      }
      else {
        pDVar3 = (DataHeader *)
                 mmap((void *)0x0,(long)(int)mystat.__glibc_reserved[2],1,1,
                      mystat.__glibc_reserved[2]._4_4_,0);
        close(mystat.__glibc_reserved[2]._4_4_);
        if (pDVar3 == (DataHeader *)0xffffffffffffffff) {
          pData_local._7_1_ = '\0';
        }
        else {
          pData->map = (pDVar3->info).dataFormat + (long)(int)mystat.__glibc_reserved[2] + -0xc;
          pData->pHeader = pDVar3;
          pData->mapAddr = pDVar3;
          pData_local._7_1_ = '\x01';
        }
      }
    }
    else {
      pData_local._7_1_ = '\0';
    }
  }
  else {
    pData_local._7_1_ = '\0';
  }
  return pData_local._7_1_;
}

Assistant:

U_CFUNC UBool
    uprv_mapFile(UDataMemory *pData, const char *path, UErrorCode *status) {
        int fd;
        int length;
        struct stat mystat;
        void *data;

        if (U_FAILURE(*status)) {
            return FALSE;
        }

        UDataMemory_init(pData); /* Clear the output struct.        */

        /* determine the length of the file */
        if(stat(path, &mystat)!=0 || mystat.st_size<=0) {
            return FALSE;
        }
        length=mystat.st_size;

        /* open the file */
        fd=open(path, O_RDONLY);
        if(fd==-1) {
            return FALSE;
        }

        /* get a view of the mapping */
#if U_PLATFORM != U_PF_HPUX
        data=mmap(0, length, PROT_READ, MAP_SHARED,  fd, 0);
#else
        data=mmap(0, length, PROT_READ, MAP_PRIVATE, fd, 0);
#endif
        close(fd); /* no longer needed */
        if(data==MAP_FAILED) {
            // Possibly check the errno value for ENOMEM, and report U_MEMORY_ALLOCATION_ERROR?
            return FALSE;
        }

        pData->map = (char *)data + length;
        pData->pHeader=(const DataHeader *)data;
        pData->mapAddr = data;
#if U_PLATFORM == U_PF_IPHONE
        posix_madvise(data, length, POSIX_MADV_RANDOM);
#endif
        return TRUE;
    }